

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O0

bool fs_is_reserved(string_view path)

{
  string_view path_00;
  _Bool _Var1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  size_type sVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  const_iterator pvVar6;
  const_iterator __last_00;
  basic_string_view<char,_std::char_traits<char>_> *pbVar7;
  __sv_type path_01;
  undefined1 local_298 [8];
  array<std::basic_string_view<char,_std::char_traits<char>_>,_30UL> r;
  size_type L;
  undefined1 local_80 [8];
  string s;
  undefined1 local_40 [8];
  string n;
  string_view path_local;
  
  n.field_2._8_8_ = path._M_len;
  _Var1 = fs_is_windows();
  if (_Var1) {
    path_00._M_str = path._M_str;
    path_00._M_len = n.field_2._8_8_;
    fs_file_name_abi_cxx11_((string *)local_40,path_00);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"."), bVar2)) {
      path_local._M_str._7_1_ = false;
      s.field_2._8_4_ = 1;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::back();
      if ((*pcVar3 == '.') || (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 == ' ')) {
        path_local._M_str._7_1_ = true;
        s.field_2._8_4_ = 1;
      }
      else {
        lVar4 = std::__cxx11::string::find_first_of(local_40,0x125ad4);
        if (lVar4 == -1) {
          path_01 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
          fs_stem_abi_cxx11_((string *)local_80,path_01);
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80);
          if ((sVar5 < 3) || (4 < sVar5)) {
            path_local._M_str._7_1_ = false;
          }
          else {
            __first._M_current = (char *)std::__cxx11::string::begin();
            __last._M_current = (char *)std::__cxx11::string::end();
            __result._M_current = (char *)std::__cxx11::string::begin();
            r._M_elems[0x1d]._M_str =
                 (char *)std::
                         transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                   (__first,__last,__result,toupper);
            memcpy((array<std::basic_string_view<char,_std::char_traits<char>_>,_30UL> *)local_298,
                   &DAT_00136b10,0x1e0);
            pvVar6 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_30UL>::begin
                               ((array<std::basic_string_view<char,_std::char_traits<char>_>,_30UL>
                                 *)local_298);
            __last_00 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_30UL>::end
                                  ((array<std::basic_string_view<char,_std::char_traits<char>_>,_30UL>
                                    *)local_298);
            pbVar7 = std::
                     find<std::basic_string_view<char,std::char_traits<char>>const*,std::__cxx11::string>
                               (pvVar6,__last_00,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_80);
            pvVar6 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_30UL>::end
                               ((array<std::basic_string_view<char,_std::char_traits<char>_>,_30UL>
                                 *)local_298);
            if (pbVar7 == pvVar6) {
              path_local._M_str._7_1_ = false;
            }
            else {
              path_local._M_str._7_1_ = true;
            }
          }
          s.field_2._8_4_ = 1;
          std::__cxx11::string::~string((string *)local_80);
        }
        else {
          path_local._M_str._7_1_ = true;
          s.field_2._8_4_ = 1;
        }
      }
    }
    std::__cxx11::string::~string((string *)local_40);
    return path_local._M_str._7_1_;
  }
  return false;
}

Assistant:

bool
fs_is_reserved(std::string_view path)
{
  // defined as https://docs.python.org/3.13/library/os.path.html#os.path.isreserved
  if(!fs_is_windows())
    return false;

  std::string const n = fs_file_name(path);

  if(n.empty() || n == ".")
    return false;

  if(n.back() == '.' || n.back() == ' ')
    return true;

  // return true if filename contains any of :*?"<>| or ends with a space or period
  // https://docs.microsoft.com/en-us/windows/win32/fileio/naming-a-file

  if(n.find_first_of(R"(<>:"/\|?*)") != std::string::npos)
    return true;

  // don't detect ASCII control characters as reserved, since multi-byte characters may falsely trip that check

  std::string s = fs_stem(n);

  if(std::string::size_type L = s.length();
      L < 3 || L > 4)
    return false;

  // convert to upper case
  std::transform(s.begin(), s.end(), s.begin(), ::toupper);

// check if the stem is a reserved device name
  constexpr std::array<std::string_view, 30> r = {"CON", "PRN", "AUX", "NUL",
    "COM1", "COM2", "COM3", "COM4", "COM5", "COM6", "COM7", "COM8", "COM9", "COM¹", "COM²", "COM³",
    "LPT1", "LPT2", "LPT3", "LPT4", "LPT5", "LPT6", "LPT7", "LPT8", "LPT9", "LPT¹", "LPT²", "LPT³",
    "CONIN$", "CONOUT$"};

#ifdef __cpp_lib_ranges_contains  // C++23
  if (std::ranges::contains(r, s))
#elif defined(__cpp_lib_ranges) // C++20
  if (std::ranges::find(r, s) != r.end())
#else // C++98
  if (std::find(r.begin(), r.end(), s) != r.end())
#endif
    return true;

return false;
}